

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O1

void read_handler(cio_websocket *websocket,void *handler_context,cio_error err,size_t frame_length,
                 uint8_t *data,size_t chunk_length,_Bool last_chunk,_Bool last_frame,_Bool is_binary
                 )

{
  cio_http_client *payload;
  void **ppvVar1;
  anon_struct_4_7_799a2f31_for_ws_flags *paVar2;
  cio_error cVar3;
  char *pcVar4;
  cio_websocket_read_handler_t frame_length_00;
  
  if (err != CIO_EOF) {
    if (err == CIO_SUCCESS) {
      pcVar4 = "false";
      if (last_frame) {
        pcVar4 = "true";
      }
      fprintf(_stdout,"Got text message (last frame: %s):",pcVar4);
      fwrite(data,chunk_length,1,_stdout);
      fflush(_stdout);
      fputc(10,_stdout);
      payload = (cio_http_client *)(websocket + 1);
      *(undefined8 *)&websocket[1].ws_private.ws_flags = 0;
      websocket[1].ws_private.read_handler = (cio_websocket_read_handler_t)0x0;
      ppvVar1 = &websocket[1].ws_private.read_handler_context;
      websocket[1].ws_private.close_timer.close_hook = (cio_timer_close_hook_t)"Hello World!";
      websocket[1].ws_private.close_timer.handler = (cio_timer_handler_t)0xc;
      websocket[1].ws_private.read_handler_context = payload;
      websocket[1].ws_private.http_client = payload;
      websocket[1].ws_private.read_frame_length = (size_t)ppvVar1;
      websocket[1].ws_private.remaining_read_frame_length = (size_t)ppvVar1;
      paVar2 = &websocket[1].ws_private.ws_flags;
      *(long *)paVar2 = *(long *)paVar2 + 1;
      frame_length_00 = websocket[1].ws_private.read_handler + 0xc;
      websocket[1].ws_private.read_handler = frame_length_00;
      cVar3 = cio_websocket_write_message_first_chunk
                        (websocket,(size_t)frame_length_00,(cio_write_buffer *)payload,true,
                         is_binary,write_complete,(void *)0x0);
      if (cVar3 != CIO_SUCCESS) {
        read_handler_cold_1();
      }
    }
    else {
      read_handler_cold_2();
    }
  }
  return;
}

Assistant:

static void read_handler(struct cio_websocket *websocket, void *handler_context, enum cio_error err, size_t frame_length, uint8_t *data, size_t chunk_length, bool last_chunk, bool last_frame, bool is_binary)
{
	(void)handler_context;
	(void)frame_length;
	(void)last_chunk;

	if (err == CIO_SUCCESS) {
		struct cio_websocket_location_handler *handler = cio_container_of(websocket, struct cio_websocket_location_handler, websocket);
		struct ws_echo_handler *echo_handler = cio_container_of(handler, struct ws_echo_handler, ws_handler);

		(void)fprintf(stdout, "Got text message (last frame: %s):", last_frame ? "true" : "false");
		(void)fwrite(data, chunk_length, 1, stdout);
		(void)fflush(stdout);
		(void)fprintf(stdout, "\n");

		static const char *text_message = "Hello World!";
		cio_write_buffer_head_init(&echo_handler->wbh);
		cio_write_buffer_const_element_init(&echo_handler->wb_message, text_message, strlen(text_message));
		cio_write_buffer_queue_tail(&echo_handler->wbh, &echo_handler->wb_message);
		err = cio_websocket_write_message_first_chunk(websocket, cio_write_buffer_get_total_size(&echo_handler->wbh), &echo_handler->wbh, true, is_binary, write_complete, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing message!\n");
		}
	} else if (err != CIO_EOF) {
		(void)fprintf(stderr, "read failure!\n");
	}
}